

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O0

void __thiscall
slang::ast::AssertionInstanceExpression::visitExprs<slang::ast::SampledValueExprVisitor&>
          (AssertionInstanceExpression *this,SampledValueExprVisitor *visitor)

{
  iterator ppSVar1;
  DeclaredType *this_00;
  Expression *this_01;
  Expression *init;
  DeclaredType *dt;
  Symbol *sym;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *__range3;
  SampledValueExprVisitor *visitor_local;
  AssertionInstanceExpression *this_local;
  
  AssertionExpr::visit<slang::ast::SampledValueExprVisitor>(this->body,visitor);
  __end3 = nonstd::span_lite::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::begin
                     (&this->localVars);
  ppSVar1 = nonstd::span_lite::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::end
                      (&this->localVars);
  while( true ) {
    if (__end3 == ppSVar1) {
      return;
    }
    this_00 = Symbol::getDeclaredType(*__end3);
    if (this_00 == (DeclaredType *)0x0) break;
    this_01 = DeclaredType::getInitializer(this_00);
    if (this_01 != (Expression *)0x0) {
      Expression::visit<slang::ast::SampledValueExprVisitor&>(this_01,visitor);
    }
    __end3 = __end3 + 1;
  }
  assert::assertFailed
            ("dt",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/expressions/MiscExpressions.h"
             ,0xe4,
             "void slang::ast::AssertionInstanceExpression::visitExprs(TVisitor &&) const [TVisitor = slang::ast::SampledValueExprVisitor &]"
            );
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        body.visit(visitor);
        for (auto sym : localVars) {
            auto dt = sym->getDeclaredType();
            ASSERT(dt);
            if (auto init = dt->getInitializer())
                init->visit(visitor);
        }
    }